

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes-tests.cpp
# Opt level: O0

void check<std::array<int,100ul>>
               (unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_> *db,
               array<int,_100UL> v)

{
  bool bVar1;
  pointer pIVar2;
  size_t local_708;
  size_t local_700;
  Decomposer local_6f1;
  unsigned_long *local_6f0;
  BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> local_6e8;
  StringRef local_6b8;
  SourceLineInfo local_6a8;
  StringRef local_698;
  undefined1 local_688 [8];
  AssertionHandler catchAssertionHandler_7;
  int local_638;
  Decomposer local_631;
  int *local_630;
  BinaryExpr<const_int_&,_const_unsigned_long_&> local_628;
  StringRef local_5f8;
  SourceLineInfo local_5e8;
  StringRef local_5d8;
  undefined1 local_5c8 [8];
  AssertionHandler catchAssertionHandler_6;
  int local_578;
  Decomposer local_571;
  int *local_570;
  BinaryExpr<const_int_&,_const_unsigned_long_&> local_568;
  StringRef local_538;
  SourceLineInfo local_528;
  StringRef local_518;
  undefined1 local_508 [8];
  AssertionHandler catchAssertionHandler_5;
  size_t local_4b8;
  Decomposer local_4a9;
  unsigned_long *local_4a8;
  BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> local_4a0;
  StringRef local_470;
  SourceLineInfo local_460;
  StringRef local_450;
  undefined1 local_440 [8];
  AssertionHandler catchAssertionHandler_4;
  int local_3f0;
  Decomposer local_3e9;
  int *local_3e8;
  BinaryExpr<const_int_&,_const_unsigned_long_&> local_3e0;
  StringRef local_3b0;
  SourceLineInfo local_3a0;
  StringRef local_390;
  undefined1 local_380 [8];
  AssertionHandler catchAssertionHandler_3;
  int local_330;
  Decomposer local_329;
  int *local_328;
  BinaryExpr<const_int_&,_const_unsigned_long_&> local_320;
  StringRef local_2f0;
  SourceLineInfo local_2e0;
  StringRef local_2d0;
  undefined1 local_2c0 [8];
  AssertionHandler catchAssertionHandler_2;
  StringRef local_270;
  SourceLineInfo local_260;
  StringRef local_250;
  undefined1 local_240 [8];
  AssertionHandler catchAssertionHandler_1;
  StringRef local_1f0;
  SourceLineInfo local_1e0;
  StringRef local_1d0;
  undefined1 local_1c0 [8];
  AssertionHandler catchAssertionHandler;
  HashedValue local_158;
  undefined1 local_120 [8];
  EncodedValue evr;
  HashedValue local_c0;
  undefined1 local_88 [8];
  EncodedValue ev;
  allocator<char> local_31;
  string local_30 [8];
  string k;
  unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_> *db_local;
  
  k.field_2._8_8_ = db;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"testkey",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  groundupdb::EncodedValue::EncodedValue<std::array<int,100ul>,void>((EncodedValue *)local_88,&v);
  pIVar2 = Catch::clara::std::
           unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>::
           operator->((unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>
                       *)k.field_2._8_8_);
  std::__cxx11::string::string((string *)&evr.m_value.m_hash,local_30);
  groundupdb::HashedValue::HashedValue<std::__cxx11::string>
            (&local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &evr.m_value.m_hash);
  (*pIVar2->_vptr_IDatabase[3])(pIVar2,&local_c0,local_88);
  groundupdb::HashedValue::~HashedValue(&local_c0);
  std::__cxx11::string::~string((string *)&evr.m_value.m_hash);
  pIVar2 = Catch::clara::std::
           unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>::
           operator->((unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>
                       *)k.field_2._8_8_);
  std::__cxx11::string::string((string *)&catchAssertionHandler.m_resultCapture,local_30);
  groundupdb::HashedValue::HashedValue<std::__cxx11::string>
            (&local_158,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &catchAssertionHandler.m_resultCapture);
  (*pIVar2->_vptr_IDatabase[5])(local_120,pIVar2,&local_158);
  groundupdb::HashedValue::~HashedValue(&local_158);
  std::__cxx11::string::~string((string *)&catchAssertionHandler.m_resultCapture);
  local_1d0 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1e0,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x3f);
  Catch::StringRef::StringRef(&local_1f0,"ev.hasValue()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_1c0,&local_1d0,&local_1e0,local_1f0,Normal);
  bVar1 = groundupdb::EncodedValue::hasValue((EncodedValue *)local_88);
  catchAssertionHandler_1.m_resultCapture._7_1_ =
       Catch::Decomposer::operator<=
                 ((Decomposer *)((long)&catchAssertionHandler_1.m_resultCapture + 6),bVar1);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)local_1c0,
             (ExprLhs<bool> *)((long)&catchAssertionHandler_1.m_resultCapture + 7));
  Catch::AssertionHandler::complete((AssertionHandler *)local_1c0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1c0);
  local_250 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x40);
  Catch::StringRef::StringRef(&local_270,"evr.hasValue()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_240,&local_250,&local_260,local_270,Normal);
  bVar1 = groundupdb::EncodedValue::hasValue((EncodedValue *)local_120);
  catchAssertionHandler_2.m_resultCapture._7_1_ =
       Catch::Decomposer::operator<=
                 ((Decomposer *)((long)&catchAssertionHandler_2.m_resultCapture + 6),bVar1);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)local_240,
             (ExprLhs<bool> *)((long)&catchAssertionHandler_2.m_resultCapture + 7));
  Catch::AssertionHandler::complete((AssertionHandler *)local_240);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_240);
  local_2d0 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2e0,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x41);
  Catch::StringRef::StringRef(&local_2f0,"0 != ev.hash()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2c0,&local_2d0,&local_2e0,local_2f0,Normal);
  local_330 = 0;
  local_328 = (int *)Catch::Decomposer::operator<=(&local_329,&local_330);
  catchAssertionHandler_3.m_resultCapture =
       (IResultCapture *)groundupdb::EncodedValue::hash((EncodedValue *)local_88);
  Catch::ExprLhs<int_const&>::operator!=
            (&local_320,(ExprLhs<int_const&> *)&local_328,
             (unsigned_long *)&catchAssertionHandler_3.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2c0,&local_320.super_ITransientExpression);
  Catch::BinaryExpr<const_int_&,_const_unsigned_long_&>::~BinaryExpr(&local_320);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2c0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2c0);
  local_390 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_3a0,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x42);
  Catch::StringRef::StringRef(&local_3b0,"0 != evr.hash()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_380,&local_390,&local_3a0,local_3b0,Normal);
  local_3f0 = 0;
  local_3e8 = (int *)Catch::Decomposer::operator<=(&local_3e9,&local_3f0);
  catchAssertionHandler_4.m_resultCapture =
       (IResultCapture *)groundupdb::EncodedValue::hash((EncodedValue *)local_120);
  Catch::ExprLhs<int_const&>::operator!=
            (&local_3e0,(ExprLhs<int_const&> *)&local_3e8,
             (unsigned_long *)&catchAssertionHandler_4.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_380,&local_3e0.super_ITransientExpression);
  Catch::BinaryExpr<const_int_&,_const_unsigned_long_&>::~BinaryExpr(&local_3e0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_380);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_380);
  local_450 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_460,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x43);
  Catch::StringRef::StringRef(&local_470,"ev.hash() == evr.hash()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_440,&local_450,&local_460,local_470,Normal);
  local_4b8 = groundupdb::EncodedValue::hash((EncodedValue *)local_88);
  local_4a8 = (unsigned_long *)Catch::Decomposer::operator<=(&local_4a9,&local_4b8);
  catchAssertionHandler_5.m_resultCapture =
       (IResultCapture *)groundupdb::EncodedValue::hash((EncodedValue *)local_120);
  Catch::ExprLhs<unsigned_long_const&>::operator==
            (&local_4a0,(ExprLhs<unsigned_long_const&> *)&local_4a8,
             (unsigned_long *)&catchAssertionHandler_5.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_440,&local_4a0.super_ITransientExpression);
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr(&local_4a0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_440);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_440);
  local_518 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_528,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x44);
  Catch::StringRef::StringRef(&local_538,"0 != ev.length()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_508,&local_518,&local_528,local_538,Normal);
  local_578 = 0;
  local_570 = (int *)Catch::Decomposer::operator<=(&local_571,&local_578);
  catchAssertionHandler_6.m_resultCapture =
       (IResultCapture *)groundupdb::EncodedValue::length((EncodedValue *)local_88);
  Catch::ExprLhs<int_const&>::operator!=
            (&local_568,(ExprLhs<int_const&> *)&local_570,
             (unsigned_long *)&catchAssertionHandler_6.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_508,&local_568.super_ITransientExpression);
  Catch::BinaryExpr<const_int_&,_const_unsigned_long_&>::~BinaryExpr(&local_568);
  Catch::AssertionHandler::complete((AssertionHandler *)local_508);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_508);
  local_5d8 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_5e8,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x45);
  Catch::StringRef::StringRef(&local_5f8,"0 != evr.length()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_5c8,&local_5d8,&local_5e8,local_5f8,Normal);
  local_638 = 0;
  local_630 = (int *)Catch::Decomposer::operator<=(&local_631,&local_638);
  catchAssertionHandler_7.m_resultCapture =
       (IResultCapture *)groundupdb::EncodedValue::length((EncodedValue *)local_120);
  Catch::ExprLhs<int_const&>::operator!=
            (&local_628,(ExprLhs<int_const&> *)&local_630,
             (unsigned_long *)&catchAssertionHandler_7.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_5c8,&local_628.super_ITransientExpression);
  Catch::BinaryExpr<const_int_&,_const_unsigned_long_&>::~BinaryExpr(&local_628);
  Catch::AssertionHandler::complete((AssertionHandler *)local_5c8);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_5c8);
  local_698 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_6a8,
             "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
             ,0x46);
  Catch::StringRef::StringRef(&local_6b8,"ev.length() == evr.length()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_688,&local_698,&local_6a8,local_6b8,Normal);
  local_700 = groundupdb::EncodedValue::length((EncodedValue *)local_88);
  local_6f0 = (unsigned_long *)Catch::Decomposer::operator<=(&local_6f1,&local_700);
  local_708 = groundupdb::EncodedValue::length((EncodedValue *)local_120);
  Catch::ExprLhs<unsigned_long_const&>::operator==
            (&local_6e8,(ExprLhs<unsigned_long_const&> *)&local_6f0,&local_708);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_688,&local_6e8.super_ITransientExpression);
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr(&local_6e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_688);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_688);
  groundupdb::EncodedValue::~EncodedValue((EncodedValue *)local_120);
  groundupdb::EncodedValue::~EncodedValue((EncodedValue *)local_88);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void check(const std::unique_ptr<groundupdb::IDatabase> &db, T v) {
  std::string k("testkey");
  groundupdb::EncodedValue ev(v);
  db->setKeyValue(k, std::move(ev));
  groundupdb::EncodedValue evr = db->getKeyValue(k);
  REQUIRE(ev.hasValue());
  REQUIRE(evr.hasValue());
  REQUIRE(0 != ev.hash());
  REQUIRE(0 != evr.hash());
  REQUIRE(ev.hash() == evr.hash());
  REQUIRE(0 != ev.length());
  REQUIRE(0 != evr.length());
  REQUIRE(ev.length() == evr.length());
}